

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_pivot_stmt.cpp
# Opt level: O1

unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> __thiscall
duckdb::Transformer::TransformPivotStatement(Transformer *this,PGSelectStmt *select)

{
  PGPivotStmt *pPVar1;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var2;
  pointer pcVar3;
  PGList *pPVar4;
  _Head_base<0UL,_duckdb::PivotRef_*,_false> _Var5;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> _Var6;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var7;
  undefined1 de_with_clause [8];
  SelectNode *pSVar8;
  pointer pSVar9;
  reference this_00;
  long *plVar10;
  pointer pTVar11;
  reference this_01;
  pointer pPVar12;
  StarExpression *pSVar13;
  pointer pPVar14;
  reference pvVar15;
  pointer pCVar16;
  type ref;
  type pSVar17;
  InternalException *this_02;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> *column;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  PGSelectStmt *in_RDX;
  pointer *__ptr;
  size_type __n;
  bool is_pivot;
  hugeint_t hVar19;
  hugeint_t input;
  templated_unique_single_t pivot_ref;
  templated_unique_single_t select_node;
  templated_unique_single_t colref;
  templated_unique_single_t new_select;
  unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> source;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  groups;
  GroupingSet set;
  _Head_base<0UL,_duckdb::PivotRef_*,_false> local_128;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> local_120;
  Transformer *local_118;
  _Head_base<0UL,_duckdb::ColumnRefExpression_*,_false> local_110;
  undefined1 local_108 [32];
  _Head_base<0UL,_duckdb::TableRef_*,_false> local_e8;
  PGPivotStmt *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  pointer local_c8;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_b8;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> local_b0;
  undefined1 local_a8 [8];
  pointer pPStack_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  _Base_ptr local_88;
  __node_base local_80;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_78;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_70;
  PGSelectStmt *local_68;
  __node_base_ptr local_60;
  __node_base_ptr local_58;
  undefined1 local_50 [32];
  
  pPVar1 = in_RDX->pivot;
  local_70._M_head_impl = (QueryNode *)this;
  local_68 = in_RDX;
  local_58 = (__node_base_ptr)ParamCount((Transformer *)select);
  local_e0 = pPVar1;
  TransformTableRefNode((Transformer *)&local_e8,(PGNode *)select);
  local_118 = (Transformer *)select;
  local_60 = (__node_base_ptr)ParamCount((Transformer *)select);
  pSVar8 = (SelectNode *)operator_new(0xf0);
  SelectNode::SelectNode(pSVar8);
  local_120._M_head_impl = pSVar8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68->withClause !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    local_a8 = (undefined1  [8])local_68->withClause;
    optional_ptr<duckdb_libpgquery::PGWithClause,_true>::CheckValid
              ((optional_ptr<duckdb_libpgquery::PGWithClause,_true> *)local_a8);
    de_with_clause = local_a8;
    pSVar9 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
             operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                         *)&local_120);
    TransformCTE(local_118,(PGWithClause *)de_with_clause,&(pSVar9->super_QueryNode).cte_map);
  }
  if (local_e0->columns == (PGList *)0x0) {
    pSVar9 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
             operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                         *)&local_120);
    _Var7._M_head_impl = local_e8._M_head_impl;
    local_e8._M_head_impl = (TableRef *)0x0;
    _Var2._M_head_impl =
         (pSVar9->from_table).
         super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pSVar9->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
    _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = _Var7._M_head_impl;
    if (_Var2._M_head_impl != (TableRef *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_TableRef + 8))();
    }
    if (local_e0->groups != (PGList *)0x0) {
      TransformStringList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)&local_d8,local_118,local_e0->groups);
      local_98._8_8_ = &pPStack_a0;
      pPStack_a0 = (pointer)((ulong)pPStack_a0 & 0xffffffff00000000);
      local_98._M_allocated_capacity = 0;
      local_80._M_nxt = (_Hash_node_base *)0x0;
      local_128._M_head_impl = (PivotRef *)0x0;
      local_88 = (_Base_ptr)local_98._8_8_;
      if (local_d8._8_8_ != local_d8._M_allocated_capacity) {
        do {
          pvVar15 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                  *)&local_d8,(size_type)local_128._M_head_impl);
          pSVar13 = (StarExpression *)operator_new(0x50);
          pcVar3 = (pvVar15->_M_dataplus)._M_p;
          local_108._0_8_ = local_108 + 0x10;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_108,pcVar3,pcVar3 + pvVar15->_M_string_length);
          ColumnRefExpression::ColumnRefExpression
                    ((ColumnRefExpression *)pSVar13,(string *)local_108);
          local_110._M_head_impl = (ColumnRefExpression *)pSVar13;
          if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
            operator_delete((void *)local_108._0_8_);
          }
          pSVar9 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                   operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                               *)&local_120);
          pCVar16 = unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
                    ::operator->((unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
                                  *)&local_110);
          (*(pCVar16->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[0xc])
                    ((string *)local_108,pCVar16);
          ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                      *)&pSVar9->select_list,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)local_108);
          if ((long *)local_108._0_8_ != (long *)0x0) {
            (**(code **)(*(long *)local_108._0_8_ + 8))();
          }
          pSVar9 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                   operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                               *)&local_120);
          local_108._0_8_ = local_110._M_head_impl;
          local_110._M_head_impl = (ColumnRefExpression *)0x0;
          ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                      *)&pSVar9->groups,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)local_108);
          if ((StarExpression *)local_108._0_8_ != (StarExpression *)0x0) {
            (**(code **)(*(long *)local_108._0_8_ + 8))();
          }
          ::std::
          _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
          ::_M_insert_unique<unsigned_long_const&>
                    ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                      *)local_a8,(unsigned_long *)&local_128);
          if ((StarExpression *)local_110._M_head_impl != (StarExpression *)0x0) {
            (*((local_110._M_head_impl)->super_ParsedExpression).super_BaseExpression.
              _vptr_BaseExpression[1])();
          }
          local_128._M_head_impl =
               (PivotRef *)((long)&((local_128._M_head_impl)->super_TableRef)._vptr_TableRef + 1);
        } while (local_128._M_head_impl < (PivotRef *)((long)(local_d8._8_8_ - local_d8._0_8_) >> 5)
                );
      }
      pSVar9 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
               operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                           *)&local_120);
      ::std::
      vector<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>,std::allocator<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>
      ::emplace_back<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>
                ((vector<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>,std::allocator<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>
                  *)&(pSVar9->groups).grouping_sets,
                 (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 local_a8);
      ::std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)local_a8);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_d8._M_local_buf);
    }
    pPVar4 = local_e0->aggrs;
    if (pPVar4 != (PGList *)0x0) {
      pSVar9 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
               operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                           *)&local_120);
      TransformExpressionList(local_118,pPVar4,&pSVar9->select_list);
    }
    pSVar17 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator*((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                         *)&local_120);
    TransformModifiers(local_118,local_68,&pSVar17->super_QueryNode);
    _Var6._M_head_impl = local_120._M_head_impl;
    local_120._M_head_impl = (SelectNode *)0x0;
    (local_70._M_head_impl)->_vptr_QueryNode = (_func_int **)_Var6._M_head_impl;
  }
  else {
    is_pivot = local_e0->unpivots == (PGList *)0x0;
    column = (_Head_base<0UL,_duckdb::ParsedExpression_*,_false> *)(ulong)is_pivot;
    TransformPivotList((vector<duckdb::PivotColumn,_true> *)&local_d8,local_118,local_e0->columns,
                       is_pivot);
    if (local_d8._8_8_ != local_d8._M_allocated_capacity) {
      __n = 0;
      do {
        this_00 = vector<duckdb::PivotColumn,_true>::operator[]
                            ((vector<duckdb::PivotColumn,_true> *)&local_d8,__n);
        if (((this_00->pivot_enum)._M_string_length == 0) &&
           ((this_00->entries).
            super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
            super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            (this_00->entries).
            super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
            super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
            _M_impl.super__Vector_impl_data._M_finish)) {
          if ((long)(this_00->pivot_expressions).
                    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this_00->pivot_expressions).
                    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != 8) {
            this_02 = (InternalException *)__cxa_allocate_exception(0x10);
            local_a8 = (undefined1  [8])&local_98;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_a8,"PIVOT statement with multiple names in pivot entry!?","")
            ;
            InternalException::InternalException(this_02,(string *)local_a8);
            __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          hVar19 = UUID::GenerateRandomUUID();
          input.lower = hVar19.upper;
          input.upper = (int64_t)column;
          BaseUUID::ToString_abi_cxx11_((string *)local_108,(BaseUUID *)hVar19.lower,input);
          plVar10 = (long *)::std::__cxx11::string::replace
                                      ((ulong)local_108,0,(char *)0x0,0x1ddd1c8);
          local_a8 = (undefined1  [8])&local_98;
          paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 == paVar18) {
            local_98._M_allocated_capacity = paVar18->_M_allocated_capacity;
            local_98._8_8_ = plVar10[3];
          }
          else {
            local_98._M_allocated_capacity = paVar18->_M_allocated_capacity;
            local_a8 = (undefined1  [8])*plVar10;
          }
          pPStack_a0 = (pointer)plVar10[1];
          *plVar10 = (long)paVar18;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          if ((StarExpression *)local_108._0_8_ != (StarExpression *)(local_108 + 0x10)) {
            operator_delete((void *)local_108._0_8_);
          }
          pSVar8 = (SelectNode *)operator_new(0xf0);
          SelectNode::SelectNode(pSVar8);
          local_108._0_8_ = pSVar8;
          pSVar9 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                   operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                               *)local_108);
          ExtractCTEsRecursive(local_118,&(pSVar9->super_QueryNode).cte_map);
          pTVar11 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::
                    operator->((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>
                                *)&local_e8);
          (*pTVar11->_vptr_TableRef[4])(&local_128,pTVar11);
          pSVar9 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                   operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                               *)local_108);
          _Var5._M_head_impl = local_128._M_head_impl;
          local_128._M_head_impl = (PivotRef *)0x0;
          _Var2._M_head_impl =
               (pSVar9->from_table).
               super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
               super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
               super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
               super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
          (pSVar9->from_table).
          super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
          super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
          super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl =
               &(_Var5._M_head_impl)->super_TableRef;
          if (_Var2._M_head_impl != (TableRef *)0x0) {
            (**(code **)((long)(_Var2._M_head_impl)->_vptr_TableRef + 8))();
          }
          if (local_128._M_head_impl != (PivotRef *)0x0) {
            (*((local_128._M_head_impl)->super_TableRef)._vptr_TableRef[1])();
          }
          local_50._0_8_ = local_50 + 0x10;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_50,local_a8,
                     (pointer)((long)&(pPStack_a0->pivot_expressions).
                                      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                      .
                                      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + (long)local_a8));
          local_b0._M_head_impl = (SelectNode *)local_108._0_8_;
          local_108._0_8_ = (StarExpression *)0x0;
          this_01 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    ::operator[](&this_00->pivot_expressions,0);
          pPVar12 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator->(this_01);
          (*(pPVar12->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_78,pPVar12);
          local_b8._M_head_impl =
               (this_00->subquery).
               super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
               super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
               super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
          (this_00->subquery).
          super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
          super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
          super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
          column = &local_78;
          AddPivotEntry(local_118,(string *)local_50,
                        (unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                         *)&local_b0,
                        (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         *)column,
                        (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>
                         *)&local_b8,local_58 < local_60);
          if (local_b8._M_head_impl != (QueryNode *)0x0) {
            (*(local_b8._M_head_impl)->_vptr_QueryNode[1])();
          }
          local_b8._M_head_impl = (QueryNode *)0x0;
          if (local_78._M_head_impl != (ParsedExpression *)0x0) {
            (*((local_78._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
          }
          local_78._M_head_impl = (ParsedExpression *)0x0;
          if (local_b0._M_head_impl != (SelectNode *)0x0) {
            (*((local_b0._M_head_impl)->super_QueryNode)._vptr_QueryNode[1])();
          }
          local_b0._M_head_impl = (SelectNode *)0x0;
          if ((pointer)local_50._0_8_ != (pointer)(local_50 + 0x10)) {
            operator_delete((void *)local_50._0_8_);
          }
          ::std::__cxx11::string::_M_assign((string *)&this_00->pivot_enum);
          if ((StarExpression *)local_108._0_8_ != (StarExpression *)0x0) {
            (**(code **)(*(long *)local_108._0_8_ + 8))();
          }
          if (local_a8 != (undefined1  [8])&local_98) {
            operator_delete((void *)local_a8);
          }
        }
        __n = __n + 1;
      } while (__n < (ulong)(((long)(local_d8._8_8_ - local_d8._0_8_) >> 4) * 0x6db6db6db6db6db7));
    }
    pSVar9 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
             operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                         *)&local_120);
    pSVar13 = (StarExpression *)operator_new(0x110);
    pPStack_a0 = (pointer)0x0;
    local_98._M_allocated_capacity = local_98._M_allocated_capacity & 0xffffffffffffff00;
    local_a8 = (undefined1  [8])&local_98;
    StarExpression::StarExpression(pSVar13,(string *)local_a8);
    if (local_a8 != (undefined1  [8])&local_98) {
      operator_delete((void *)local_a8);
    }
    local_108._0_8_ = pSVar13;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&pSVar9->select_list,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_108);
    if ((StarExpression *)local_108._0_8_ != (StarExpression *)0x0) {
      (**(code **)(*(long *)local_108._0_8_ + 8))();
    }
    local_128._M_head_impl = (PivotRef *)operator_new(0x120);
    ((local_128._M_head_impl)->super_TableRef).type = PIVOT;
    ((local_128._M_head_impl)->super_TableRef).alias._M_dataplus._M_p =
         (pointer)&((local_128._M_head_impl)->super_TableRef).alias.field_2;
    ((local_128._M_head_impl)->super_TableRef).alias._M_string_length = 0;
    ((local_128._M_head_impl)->super_TableRef).alias.field_2._M_local_buf[0] = '\0';
    ((local_128._M_head_impl)->super_TableRef).sample.
    super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
    super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
    super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl = (SampleOptions *)0x0;
    ((local_128._M_head_impl)->super_TableRef).query_location.index = 0xffffffffffffffff;
    ((local_128._M_head_impl)->super_TableRef).external_dependency.internal.
    super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    ((local_128._M_head_impl)->super_TableRef).external_dependency.internal.
    super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ((local_128._M_head_impl)->super_TableRef).column_name_alias.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_128._M_head_impl)->super_TableRef).column_name_alias.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_128._M_head_impl)->super_TableRef).column_name_alias.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((local_128._M_head_impl)->super_TableRef)._vptr_TableRef =
         (_func_int **)&PTR__PivotRef_02486d00;
    ((local_128._M_head_impl)->source).
    super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)0x0;
    ((local_128._M_head_impl)->aggregates).
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_128._M_head_impl)->aggregates).
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_128._M_head_impl)->aggregates).
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((local_128._M_head_impl)->unpivot_names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_128._M_head_impl)->unpivot_names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_128._M_head_impl)->unpivot_names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((local_128._M_head_impl)->pivots).
    super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
    super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_128._M_head_impl)->pivots).
    super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
    super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_128._M_head_impl)->pivots).
    super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
    super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((local_128._M_head_impl)->groups).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_128._M_head_impl)->groups).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)
     ((long)&((local_128._M_head_impl)->groups).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
    *(undefined8 *)
     ((long)&((local_128._M_head_impl)->groups).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
    ((local_128._M_head_impl)->bound_aggregate_names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((local_128._M_head_impl)->bound_aggregate_names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_128._M_head_impl)->bound_aggregate_names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_128._M_head_impl)->bound_group_names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_128._M_head_impl)->bound_group_names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((local_128._M_head_impl)->bound_pivot_values).
    super_vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((local_128._M_head_impl)->bound_group_names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_128._M_head_impl)->bound_pivot_values).
    super_vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_128._M_head_impl)->bound_pivot_values).
    super_vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pPVar14 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator->
                        ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>
                          *)&local_128);
    _Var7._M_head_impl = local_e8._M_head_impl;
    local_e8._M_head_impl = (TableRef *)0x0;
    _Var2._M_head_impl =
         (pPVar14->source).
         super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pPVar14->source).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
    _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = _Var7._M_head_impl;
    if (_Var2._M_head_impl != (TableRef *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_TableRef + 8))();
    }
    if (local_e0->unpivots == (PGList *)0x0) {
      pPVar4 = local_e0->aggrs;
      if (pPVar4 == (PGList *)0x0) {
        local_a8 = (undefined1  [8])0x0;
        pPStack_a0 = (pointer)0x0;
        local_98._M_allocated_capacity = 0;
        make_uniq<duckdb::FunctionExpression,char_const(&)[11],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
                  ((duckdb *)local_108,(char (*) [11])"count_star",
                   (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    *)local_a8);
        pPVar14 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::
                  operator->((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>
                              *)&local_128);
        local_110._M_head_impl = (ColumnRefExpression *)local_108._0_8_;
        local_108._0_8_ = (StarExpression *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&pPVar14->aggregates,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_110);
        if ((StarExpression *)local_110._M_head_impl != (StarExpression *)0x0) {
          (*((local_110._M_head_impl)->super_ParsedExpression).super_BaseExpression.
            _vptr_BaseExpression[1])();
        }
        if ((StarExpression *)local_108._0_8_ != (StarExpression *)0x0) {
          (**(code **)(*(long *)local_108._0_8_ + 8))();
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   *)local_a8);
      }
      else {
        pPVar14 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::
                  operator->((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>
                              *)&local_128);
        TransformExpressionList(local_118,pPVar4,&pPVar14->aggregates);
      }
    }
    else {
      TransformStringList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)local_108,local_118,local_e0->unpivots);
      pPVar14 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::
                operator->((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>
                            *)&local_128);
      local_a8 = (undefined1  [8])
                 (pPVar14->unpivot_names).
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pPStack_a0 = (pointer)(pPVar14->unpivot_names).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
      local_98._M_allocated_capacity =
           (size_type)
           (pPVar14->unpivot_names).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pPVar14->unpivot_names).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_108._0_8_;
      (pPVar14->unpivot_names).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_108._8_8_;
      (pPVar14->unpivot_names).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_108._16_8_;
      local_108._0_8_ = (StarExpression *)0x0;
      local_108._8_8_ = (pointer)0x0;
      local_108._16_8_ = (pointer)0x0;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a8);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_108);
    }
    if (local_e0->groups != (PGList *)0x0) {
      TransformStringList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)local_108,local_118,local_e0->groups);
      pPVar14 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::
                operator->((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>
                            *)&local_128);
      local_a8 = (undefined1  [8])
                 (pPVar14->groups).
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pPStack_a0 = (pointer)(pPVar14->groups).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
      local_98._M_allocated_capacity =
           (size_type)
           (pPVar14->groups).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pPVar14->groups).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_108._0_8_;
      (pPVar14->groups).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_108._8_8_;
      (pPVar14->groups).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_108._16_8_;
      local_108._0_8_ = (StarExpression *)0x0;
      local_108._8_8_ = (pointer)0x0;
      local_108._16_8_ = (pointer)0x0;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a8);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_108);
    }
    pPVar14 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator->
                        ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>
                          *)&local_128);
    local_a8 = (undefined1  [8])
               (pPVar14->pivots).
               super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
               super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl
               .super__Vector_impl_data._M_start;
    pPStack_a0 = (pPVar14->pivots).
                 super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
                 super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    local_98._M_allocated_capacity =
         (size_type)
         (pPVar14->pivots).super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
         super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (pPVar14->pivots).super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
    super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_d8._M_allocated_capacity;
    (pPVar14->pivots).super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
    super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_d8._8_8_;
    (pPVar14->pivots).super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
    super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_c8;
    local_d8._M_allocated_capacity = 0;
    local_d8._8_8_ = (pointer)0x0;
    local_c8 = (pointer)0x0;
    ::std::vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>::~vector
              ((vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_> *)local_a8);
    ref = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator*
                    ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true> *)
                     &local_128);
    SetQueryLocation(&ref->super_TableRef,local_e0->location);
    _Var5._M_head_impl = local_128._M_head_impl;
    local_128._M_head_impl = (PivotRef *)0x0;
    pSVar9 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
             operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                         *)&local_120);
    _Var2._M_head_impl =
         (pSVar9->from_table).
         super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pSVar9->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
    _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl =
         &(_Var5._M_head_impl)->super_TableRef;
    if (_Var2._M_head_impl != (TableRef *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_TableRef + 8))();
    }
    pSVar17 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator*((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                         *)&local_120);
    TransformModifiers(local_118,local_68,&pSVar17->super_QueryNode);
    _Var6._M_head_impl = local_120._M_head_impl;
    local_120._M_head_impl = (SelectNode *)0x0;
    ((optional_ptr<duckdb::Transformer,_true> *)&(local_70._M_head_impl)->_vptr_QueryNode)->ptr =
         (Transformer *)_Var6._M_head_impl;
    if (local_128._M_head_impl != (PivotRef *)0x0) {
      (*((local_128._M_head_impl)->super_TableRef)._vptr_TableRef[1])();
    }
    ::std::vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>::~vector
              ((vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_> *)&local_d8);
  }
  if (local_120._M_head_impl != (SelectNode *)0x0) {
    (*((local_120._M_head_impl)->super_QueryNode)._vptr_QueryNode[1])();
  }
  if ((Transformer *)local_e8._M_head_impl != (Transformer *)0x0) {
    (*(code *)((optional_ptr<duckdb::Transformer,_true> *)&(local_e8._M_head_impl)->_vptr_TableRef)
              ->ptr->options)();
  }
  return (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)
         (_Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>)
         local_70._M_head_impl;
}

Assistant:

unique_ptr<QueryNode> Transformer::TransformPivotStatement(duckdb_libpgquery::PGSelectStmt &select) {
	auto pivot = select.pivot;
	auto current_param_count = ParamCount();
	auto source = TransformTableRefNode(*pivot->source);
	auto next_param_count = ParamCount();
	bool has_parameters = next_param_count > current_param_count;

	auto select_node = make_uniq<SelectNode>();
	// handle the CTEs
	if (select.withClause) {
		TransformCTE(*PGPointerCast<duckdb_libpgquery::PGWithClause>(select.withClause), select_node->cte_map);
	}
	if (!pivot->columns) {
		// no pivot columns - not actually a pivot
		select_node->from_table = std::move(source);
		if (pivot->groups) {
			auto groups = TransformStringList(pivot->groups);
			GroupingSet set;
			for (idx_t gr = 0; gr < groups.size(); gr++) {
				auto &group = groups[gr];
				auto colref = make_uniq<ColumnRefExpression>(group);
				select_node->select_list.push_back(colref->Copy());
				select_node->groups.group_expressions.push_back(std::move(colref));
				set.insert(gr);
			}
			select_node->groups.grouping_sets.push_back(std::move(set));
		}
		if (pivot->aggrs) {
			TransformExpressionList(*pivot->aggrs, select_node->select_list);
		}
		// transform order by/limit modifiers
		TransformModifiers(select, *select_node);
		return std::move(select_node);
	}

	// generate CREATE TYPE statements for each of the columns that do not have an IN list
	bool is_pivot = !pivot->unpivots;
	auto columns = TransformPivotList(*pivot->columns, is_pivot);
	for (idx_t c = 0; c < columns.size(); c++) {
		auto &col = columns[c];
		if (!col.pivot_enum.empty() || !col.entries.empty()) {
			continue;
		}
		if (col.pivot_expressions.size() != 1) {
			throw InternalException("PIVOT statement with multiple names in pivot entry!?");
		}
		auto enum_name = "__pivot_enum_" + UUID::ToString(UUID::GenerateRandomUUID());

		auto new_select = make_uniq<SelectNode>();
		ExtractCTEsRecursive(new_select->cte_map);
		new_select->from_table = source->Copy();
		AddPivotEntry(enum_name, std::move(new_select), col.pivot_expressions[0]->Copy(), std::move(col.subquery),
		              has_parameters);
		col.pivot_enum = enum_name;
	}

	// generate the actual query, including the pivot
	select_node->select_list.push_back(make_uniq<StarExpression>());

	auto pivot_ref = make_uniq<PivotRef>();
	pivot_ref->source = std::move(source);
	if (pivot->unpivots) {
		pivot_ref->unpivot_names = TransformStringList(pivot->unpivots);
	} else {
		if (pivot->aggrs) {
			TransformExpressionList(*pivot->aggrs, pivot_ref->aggregates);
		} else {
			// pivot but no aggregates specified - push a count star
			vector<unique_ptr<ParsedExpression>> children;
			auto function = make_uniq<FunctionExpression>("count_star", std::move(children));
			pivot_ref->aggregates.push_back(std::move(function));
		}
	}
	if (pivot->groups) {
		pivot_ref->groups = TransformStringList(pivot->groups);
	}
	pivot_ref->pivots = std::move(columns);
	SetQueryLocation(*pivot_ref, pivot->location);
	select_node->from_table = std::move(pivot_ref);
	// transform order by/limit modifiers
	TransformModifiers(select, *select_node);

	return std::move(select_node);
}